

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocalsocket_unix.cpp
# Opt level: O3

void __thiscall
QLocalSocketPrivate::describeSocket(QLocalSocketPrivate *this,qintptr socketDescriptor)

{
  bool bVar1;
  int iVar2;
  long in_FS_OFFSET;
  socklen_t len;
  bool abstractAddress;
  QFlagsStorage<QLocalSocket::SocketOption> local_a4;
  socklen_t local_a0;
  bool local_99;
  sockaddr_un local_98;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_99 = false;
  local_a0 = 0x6e;
  local_98.sun_family = 0;
  local_98.sun_path[0] = '\0';
  local_98.sun_path[1] = '\0';
  local_98.sun_path[2] = '\0';
  local_98.sun_path[3] = '\0';
  local_98.sun_path[4] = '\0';
  local_98.sun_path[5] = '\0';
  local_98.sun_path[6] = '\0';
  local_98.sun_path[7] = '\0';
  local_98.sun_path[8] = '\0';
  local_98.sun_path[9] = '\0';
  local_98.sun_path[10] = '\0';
  local_98.sun_path[0xb] = '\0';
  local_98.sun_path[0xc] = '\0';
  local_98.sun_path[0xd] = '\0';
  local_98.sun_path[0xe] = '\0';
  local_98.sun_path[0xf] = '\0';
  local_98.sun_path[0x10] = '\0';
  local_98.sun_path[0x11] = '\0';
  local_98.sun_path[0x12] = '\0';
  local_98.sun_path[0x13] = '\0';
  local_98.sun_path[0x14] = '\0';
  local_98.sun_path[0x15] = '\0';
  local_98.sun_path[0x16] = '\0';
  local_98.sun_path[0x17] = '\0';
  local_98.sun_path[0x18] = '\0';
  local_98.sun_path[0x19] = '\0';
  local_98.sun_path[0x1a] = '\0';
  local_98.sun_path[0x1b] = '\0';
  local_98.sun_path[0x1c] = '\0';
  local_98.sun_path[0x1d] = '\0';
  local_98.sun_path[0x1e] = '\0';
  local_98.sun_path[0x1f] = '\0';
  local_98.sun_path[0x20] = '\0';
  local_98.sun_path[0x21] = '\0';
  local_98.sun_path[0x22] = '\0';
  local_98.sun_path[0x23] = '\0';
  local_98.sun_path[0x24] = '\0';
  local_98.sun_path[0x25] = '\0';
  local_98.sun_path[0x26] = '\0';
  local_98.sun_path[0x27] = '\0';
  local_98.sun_path[0x28] = '\0';
  local_98.sun_path[0x29] = '\0';
  local_98.sun_path[0x2a] = '\0';
  local_98.sun_path[0x2b] = '\0';
  local_98.sun_path[0x2c] = '\0';
  local_98.sun_path[0x2d] = '\0';
  local_98.sun_path[0x2e] = '\0';
  local_98.sun_path[0x2f] = '\0';
  local_98.sun_path[0x30] = '\0';
  local_98.sun_path[0x31] = '\0';
  local_98.sun_path[0x32] = '\0';
  local_98.sun_path[0x33] = '\0';
  local_98.sun_path[0x34] = '\0';
  local_98.sun_path[0x35] = '\0';
  local_98.sun_path[0x36] = '\0';
  local_98.sun_path[0x37] = '\0';
  local_98.sun_path[0x38] = '\0';
  local_98.sun_path[0x39] = '\0';
  local_98.sun_path[0x3a] = '\0';
  local_98.sun_path[0x3b] = '\0';
  local_98.sun_path[0x3c] = '\0';
  local_98.sun_path[0x3d] = '\0';
  local_98.sun_path[0x3e] = '\0';
  local_98.sun_path[0x3f] = '\0';
  local_98.sun_path[0x40] = '\0';
  local_98.sun_path[0x41] = '\0';
  local_98.sun_path[0x42] = '\0';
  local_98.sun_path[0x43] = '\0';
  local_98.sun_path[0x44] = '\0';
  local_98.sun_path[0x45] = '\0';
  local_98.sun_path[0x46] = '\0';
  local_98.sun_path[0x47] = '\0';
  local_98.sun_path[0x48] = '\0';
  local_98.sun_path[0x49] = '\0';
  local_98.sun_path[0x4a] = '\0';
  local_98.sun_path[0x4b] = '\0';
  local_98.sun_path[0x4c] = '\0';
  local_98.sun_path[0x4d] = '\0';
  local_98.sun_path[0x4e] = '\0';
  local_98.sun_path[0x4f] = '\0';
  local_98.sun_path[0x50] = '\0';
  local_98.sun_path[0x51] = '\0';
  local_98.sun_path[0x52] = '\0';
  local_98.sun_path[0x53] = '\0';
  local_98.sun_path[0x54] = '\0';
  local_98.sun_path[0x55] = '\0';
  local_98.sun_path[0x56] = '\0';
  local_98.sun_path[0x57] = '\0';
  local_98.sun_path[0x58] = '\0';
  local_98.sun_path[0x59] = '\0';
  local_98.sun_path[0x5a] = '\0';
  local_98.sun_path[0x5b] = '\0';
  local_98.sun_path[0x5c] = '\0';
  local_98.sun_path[0x5d] = '\0';
  local_98.sun_path[0x5e] = '\0';
  local_98.sun_path[0x5f] = '\0';
  local_98.sun_path[0x60] = '\0';
  local_98.sun_path[0x61] = '\0';
  local_98.sun_path[0x62] = '\0';
  local_98.sun_path[99] = '\0';
  local_98.sun_path[100] = '\0';
  local_98.sun_path[0x65] = '\0';
  local_98.sun_path[0x66] = '\0';
  local_98.sun_path[0x67] = '\0';
  local_98.sun_path[0x68] = '\0';
  local_98.sun_path[0x69] = '\0';
  local_98.sun_path[0x6a] = '\0';
  local_98.sun_path[0x6b] = '\0';
  iVar2 = getpeername((int)socketDescriptor,(sockaddr *)&local_98,&local_a0);
  if (local_a0 == 2 || iVar2 != 0) {
    local_a0 = 0x6e;
    iVar2 = getsockname((int)socketDescriptor,(sockaddr *)&local_98,&local_a0);
    if (iVar2 != 0) goto LAB_00243e0b;
  }
  bVar1 = parseSockaddr(&local_98,local_a0,&this->fullServerName,&this->serverName,&local_99);
  if (bVar1) {
    if ((*(long **)&this->field_0x48 != (long *)0x0) && (**(long **)&this->field_0x48 != 0)) {
      QBindingStorage::registerDependency_helper((QUntypedPropertyData *)&this->field_0x40);
    }
    local_a4.i = (this->socketOptions).super_QPropertyData<QFlags<QLocalSocket::SocketOption>_>.val.
                 super_QFlagsStorageHelper<QLocalSocket::SocketOption,_4>.
                 super_QFlagsStorage<QLocalSocket::SocketOption>.i & 0xfffffffe | (uint)local_99;
    QObjectBindableProperty<QLocalSocketPrivate,_QFlags<QLocalSocket::SocketOption>,_&QLocalSocketPrivate::_qt_property_socketOptions_offset,_nullptr>
    ::setValue(&this->socketOptions,(parameter_type)&local_a4);
  }
LAB_00243e0b:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QLocalSocketPrivate::describeSocket(qintptr socketDescriptor)
{
    bool abstractAddress = false;

    struct ::sockaddr_un addr;
    QT_SOCKLEN_T len = sizeof(addr);
    memset(&addr, 0, sizeof(addr));
    const int getpeernameStatus = ::getpeername(socketDescriptor, (sockaddr *)&addr, &len);
    if (getpeernameStatus != 0 || len == offsetof(sockaddr_un, sun_path)) {
        // this is the case when we call it from QLocalServer, then there is no peername
        len = sizeof(addr);
        if (::getsockname(socketDescriptor, (sockaddr *)&addr, &len) != 0)
            return;
    }
    if (parseSockaddr(addr, static_cast<uint>(len), fullServerName, serverName, abstractAddress)) {
        QLocalSocket::SocketOptions options = socketOptions.value();
        socketOptions = options.setFlag(QLocalSocket::AbstractNamespaceOption, abstractAddress);
    }
}